

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.h
# Opt level: O0

bool __thiscall cmWorkerPool::EmplaceJob<cmQtAutoMocUic::JobMocPredefsT>(cmWorkerPool *this)

{
  bool bVar1;
  unique_ptr<cmQtAutoMocUic::JobMocPredefsT,_std::default_delete<cmQtAutoMocUic::JobMocPredefsT>_>
  local_20;
  unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_> local_18;
  cmWorkerPool *local_10;
  cmWorkerPool *this_local;
  
  local_10 = this;
  std::make_unique<cmQtAutoMocUic::JobMocPredefsT>();
  std::unique_ptr<cmWorkerPool::JobT,std::default_delete<cmWorkerPool::JobT>>::
  unique_ptr<cmQtAutoMocUic::JobMocPredefsT,std::default_delete<cmQtAutoMocUic::JobMocPredefsT>,void>
            ((unique_ptr<cmWorkerPool::JobT,std::default_delete<cmWorkerPool::JobT>> *)&local_18,
             &local_20);
  bVar1 = PushJob(this,(JobHandleT *)&local_18);
  std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>::~unique_ptr
            (&local_18);
  std::
  unique_ptr<cmQtAutoMocUic::JobMocPredefsT,_std::default_delete<cmQtAutoMocUic::JobMocPredefsT>_>::
  ~unique_ptr(&local_20);
  return bVar1;
}

Assistant:

bool EmplaceJob(Args&&... args)
  {
    return PushJob(cm::make_unique<T>(std::forward<Args>(args)...));
  }